

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool __thiscall
IR::MultiBranchInstr::ReplaceTarget
          (MultiBranchInstr *this,LabelInstr *oldLabelInstr,LabelInstr *newLabelInstr)

{
  RealCount *pRVar1;
  Kind KVar2;
  long *plVar3;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  undefined4 *puVar8;
  long lVar9;
  Type pSVar10;
  char *message;
  char *error;
  long *plVar11;
  uint lineNumber;
  char *fileName;
  LabelInstr *pLVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  bVar6 = (this->super_BranchInstr).m_isMultiBranch;
  if ((this->super_BranchInstr).m_branchTarget == (LabelInstr *)0x0) {
    if (bVar6 == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
      ;
      error = "(m_isMultiBranch)";
      message = "m_isMultiBranch";
      lineNumber = 0x20e;
      goto LAB_004b64ec;
    }
  }
  else {
    if (bVar6 == false) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
      if (!bVar6) goto LAB_004b6791;
      *puVar8 = 0;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp";
    error = "(this->IsMultiBranch())";
    message = "this->IsMultiBranch()";
    lineNumber = 0x6ee;
LAB_004b64ec:
    bVar6 = Js::Throw::ReportAssert(fileName,lineNumber,error,message);
    if (!bVar6) goto LAB_004b6791;
    *puVar8 = 0;
  }
  plVar3 = (long *)this->m_branchTargets;
  if (plVar3 == (long *)0x0) {
    return false;
  }
  KVar2 = this->m_kind;
  if ((KVar2 == IntJumpTable) || (KVar2 == SingleCharStrJumpTable)) {
    plVar11 = plVar3 + 1;
    lVar16 = this->m_baseCaseValue;
    lVar9 = this->m_lastCaseValue;
    if (lVar16 <= lVar9) {
      lVar4 = *plVar3;
      bVar6 = false;
      do {
        lVar15 = lVar4 + this->m_baseCaseValue * -8;
        pLVar12 = *(LabelInstr **)(lVar15 + lVar16 * 8);
        if (pLVar12 == oldLabelInstr) {
          if (oldLabelInstr != (LabelInstr *)0x0) {
            LabelInstr::RemoveLabelRef(pLVar12,&this->super_BranchInstr);
          }
          if (newLabelInstr != (LabelInstr *)0x0) {
            pSVar10 = (Type)new<Memory::ArenaAllocator>
                                      (0x10,(newLabelInstr->labelRefs).
                                            super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                            .allocator,0x364470);
            pSVar10[1].next = (Type)this;
            pSVar10->next =
                 (newLabelInstr->labelRefs).
                 super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
            (newLabelInstr->labelRefs).
            super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar10;
            pRVar1 = &(newLabelInstr->labelRefs).
                      super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                      super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                      super_RealCount;
            pRVar1->count = pRVar1->count + 1;
          }
          lVar9 = this->m_lastCaseValue;
          bVar6 = true;
          pLVar12 = newLabelInstr;
        }
        *(LabelInstr **)(lVar15 + lVar16 * 8) = pLVar12;
        lVar16 = lVar16 + 1;
      } while (lVar16 <= lVar9);
      goto LAB_004b6726;
    }
  }
  else {
    if (KVar2 != StrDictionary) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                         ,0x435,"(false)","false");
      if (!bVar6) {
LAB_004b6791:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
      bVar6 = false;
      plVar11 = (long *)0x0;
      goto LAB_004b6726;
    }
    plVar11 = plVar3 + 7;
    uVar7 = *(uint *)((long)plVar3 + 0x1c);
    if (uVar7 != 0) {
      bVar6 = false;
      uVar13 = 0;
      do {
        iVar14 = *(int *)(*plVar3 + uVar13 * 4);
        if (iVar14 != -1) {
          do {
            lVar16 = plVar3[1];
            lVar9 = (long)iVar14;
            iVar14 = *(int *)(lVar16 + 8 + lVar9 * 0x18);
            pLVar12 = *(LabelInstr **)(lVar16 + lVar9 * 0x18);
            if (pLVar12 == oldLabelInstr) {
              if (oldLabelInstr != (LabelInstr *)0x0) {
                LabelInstr::RemoveLabelRef(pLVar12,&this->super_BranchInstr);
              }
              bVar6 = true;
              if (newLabelInstr == (LabelInstr *)0x0) {
                pLVar12 = (LabelInstr *)0x0;
              }
              else {
                pSVar10 = (Type)new<Memory::ArenaAllocator>
                                          (0x10,(newLabelInstr->labelRefs).
                                                super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                                .allocator,0x364470);
                pSVar10[1].next = (Type)this;
                pSVar10->next =
                     (newLabelInstr->labelRefs).
                     super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
                (newLabelInstr->labelRefs).
                super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar10;
                pRVar1 = &(newLabelInstr->labelRefs).
                          super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                          super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                          super_RealCount;
                pRVar1->count = pRVar1->count + 1;
                pLVar12 = newLabelInstr;
              }
            }
            *(LabelInstr **)(lVar16 + lVar9 * 0x18) = pLVar12;
          } while (iVar14 != -1);
          uVar7 = *(uint *)((long)plVar3 + 0x1c);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar7);
      goto LAB_004b6726;
    }
  }
  bVar6 = false;
LAB_004b6726:
  pLVar12 = (LabelInstr *)*plVar11;
  if (pLVar12 == oldLabelInstr) {
    if (oldLabelInstr != (LabelInstr *)0x0) {
      LabelInstr::RemoveLabelRef(pLVar12,&this->super_BranchInstr);
    }
    bVar6 = true;
    if (newLabelInstr == (LabelInstr *)0x0) {
      pLVar12 = (LabelInstr *)0x0;
    }
    else {
      pSVar10 = (Type)new<Memory::ArenaAllocator>
                                (0x10,(newLabelInstr->labelRefs).
                                      super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                      .allocator,0x364470);
      pSVar10[1].next = (Type)this;
      pSVar10->next =
           (newLabelInstr->labelRefs).
           super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
      (newLabelInstr->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar10;
      pRVar1 = &(newLabelInstr->labelRefs).
                super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      pLVar12 = newLabelInstr;
    }
  }
  *plVar11 = (long)pLVar12;
  return bVar6;
}

Assistant:

bool
MultiBranchInstr::ReplaceTarget(IR::LabelInstr * oldLabelInstr, IR::LabelInstr * newLabelInstr)
{
    Assert(this->IsMultiBranch());
    bool remapped = false;
    this->UpdateMultiBrLabels([=, &remapped](IR::LabelInstr * targetLabel) -> IR::LabelInstr *
    {
        if (targetLabel == oldLabelInstr)
        {
            this->ChangeLabelRef(targetLabel, newLabelInstr);
            remapped = true;
            return newLabelInstr;
        }
        return targetLabel;
    });
    return remapped;
}